

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsStorage.cpp
# Opt level: O2

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseStorage::initPrograms
          (SparseShaderIntrinsicsCaseStorage *this,SourceCollections *programCollection)

{
  TextureFormat *format;
  ImageType imageType;
  ostream *poVar1;
  SpirVAsmSource *src_00;
  ImageType in_ECX;
  ImageType imageType_00;
  TextureFormat *format_00;
  TextureFormat *format_01;
  TextureFormat *format_02;
  TextureFormat *format_03;
  allocator<char> local_3a4;
  allocator<char> local_3a3;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  string typeImgCompVec4;
  string local_380;
  string typeImgComp;
  string local_340;
  string coordString;
  string local_300;
  string typeUniformConstImageSparse;
  string typeImageSparse;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string formatQualStr;
  string formatDataStr;
  string imageTypeStr;
  ostringstream src;
  
  format = &(this->super_SparseShaderIntrinsicsCaseBase).m_format;
  getShaderImageType_abi_cxx11_
            (&imageTypeStr,(sparse *)format,
             (TextureFormat *)(ulong)(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,in_ECX
            );
  getShaderImageDataType_abi_cxx11_(&formatDataStr,(sparse *)format,format_00);
  getShaderImageFormatQualifier_abi_cxx11_(&formatQualStr,(sparse *)format,format_01);
  imageType = (this->super_SparseShaderIntrinsicsCaseBase).m_imageType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&src,"%local_int_GlobalInvocationID_x",(allocator<char> *)&typeImageSparse);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeImgComp,"%local_ivec2_GlobalInvocationID_xy",
             (allocator<char> *)&typeUniformConstImageSparse);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeImgCompVec4,"%local_ivec3_GlobalInvocationID_xyz",
             (allocator<char> *)&local_380);
  getShaderImageCoordinates(&coordString,imageType,(string *)&src,&typeImgComp,&typeImgCompVec4);
  std::__cxx11::string::~string((string *)&typeImgCompVec4);
  std::__cxx11::string::~string((string *)&typeImgComp);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  getImageComponentTypeName_abi_cxx11_(&typeImgComp,(sparse *)format,format_02);
  getImageComponentVec4TypeName_abi_cxx11_(&typeImgCompVec4,(sparse *)format,format_03);
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])(&typeImageSparse,this);
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[8])(&typeUniformConstImageSparse,this);
  poVar1 = std::operator<<((ostream *)&src,"OpCapability Shader\n");
  poVar1 = std::operator<<(poVar1,"OpCapability ImageCubeArray\n");
  poVar1 = std::operator<<(poVar1,"OpCapability SparseResidency\n");
  poVar1 = std::operator<<(poVar1,"OpCapability StorageImageExtendedFormats\n");
  poVar1 = std::operator<<(poVar1,"%ext_import = OpExtInstImport \"GLSL.std.450\"\n");
  poVar1 = std::operator<<(poVar1,"OpMemoryModel Logical GLSL450\n");
  poVar1 = std::operator<<(poVar1,
                           "OpEntryPoint GLCompute %func_main \"main\" %input_GlobalInvocationID\n")
  ;
  poVar1 = std::operator<<(poVar1,"OpExecutionMode %func_main LocalSize 1 1 1\n");
  poVar1 = std::operator<<(poVar1,"OpSource GLSL 440\n");
  poVar1 = std::operator<<(poVar1,"OpName %func_main \"main\"\n");
  poVar1 = std::operator<<(poVar1,"OpName %input_GlobalInvocationID \"gl_GlobalInvocationID\"\n");
  poVar1 = std::operator<<(poVar1,"OpName %input_WorkGroupSize \"gl_WorkGroupSize\"\n");
  poVar1 = std::operator<<(poVar1,"OpName %uniform_image_sparse \"u_imageSparse\"\n");
  poVar1 = std::operator<<(poVar1,"OpName %uniform_image_texels \"u_imageTexels\"\n");
  poVar1 = std::operator<<(poVar1,"OpName %uniform_image_residency \"u_imageResidency\"\n");
  poVar1 = std::operator<<(poVar1,
                           "OpDecorate %input_GlobalInvocationID BuiltIn GlobalInvocationId\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %input_WorkGroupSize BuiltIn WorkgroupSize\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %constant_uint_grid_x SpecId 1\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %constant_uint_grid_y SpecId 2\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %constant_uint_grid_z SpecId 3\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %constant_uint_work_group_size_x SpecId 4\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %constant_uint_work_group_size_y SpecId 5\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %constant_uint_work_group_size_z SpecId 6\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_sparse DescriptorSet 0\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_sparse Binding ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_texels DescriptorSet 0\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_texels Binding ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_texels NonReadable\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_residency DescriptorSet 0\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_residency Binding ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"OpDecorate %uniform_image_residency NonReadable\n");
  poVar1 = std::operator<<(poVar1,"%type_bool\t\t\t\t\t\t= OpTypeBool\n");
  poVar1 = std::operator<<(poVar1,"%type_int\t\t\t\t\t\t= OpTypeInt 32 1\n");
  poVar1 = std::operator<<(poVar1,"%type_uint\t\t\t\t\t\t= OpTypeInt 32 0\n");
  poVar1 = std::operator<<(poVar1,"%type_ivec2\t\t\t\t\t\t= OpTypeVector %type_int  2\n");
  poVar1 = std::operator<<(poVar1,"%type_ivec3\t\t\t\t\t\t= OpTypeVector %type_int  3\n");
  poVar1 = std::operator<<(poVar1,"%type_ivec4\t\t\t\t\t\t= OpTypeVector %type_int  4\n");
  poVar1 = std::operator<<(poVar1,"%type_uvec3\t\t\t\t\t\t= OpTypeVector %type_uint 3\n");
  poVar1 = std::operator<<(poVar1,"%type_uvec4\t\t\t\t\t\t= OpTypeVector %type_uint 4\n");
  poVar1 = std::operator<<(poVar1,"%type_struct_int_img_comp_vec4\t= OpTypeStruct %type_int ");
  poVar1 = std::operator<<(poVar1,(string *)&typeImgCompVec4);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"%type_input_uint\t\t= OpTypePointer Input %type_uint\n");
  poVar1 = std::operator<<(poVar1,"%type_input_uvec3\t\t= OpTypePointer Input %type_uvec3\n");
  poVar1 = std::operator<<(poVar1,"%type_function_int\t\t\t = OpTypePointer Function %type_int\n");
  poVar1 = std::operator<<(poVar1,"%type_function_img_comp_vec4 = OpTypePointer Function ");
  poVar1 = std::operator<<(poVar1,(string *)&typeImgCompVec4);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"%type_void\t\t\t\t= OpTypeVoid\n");
  poVar1 = std::operator<<(poVar1,"%type_void_func\t\t\t= OpTypeFunction %type_void\n");
  poVar1 = std::operator<<(poVar1,"%type_image_sparse = ");
  getOpTypeImageSparse
            (&local_380,(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,format,&typeImgComp
             ,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_380);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_image_sparse\n"
                          );
  poVar1 = std::operator<<(poVar1,"%type_image_sparse_with_sampler = ");
  getOpTypeImageSparse
            (&local_340,(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,format,&typeImgComp
             ,true);
  poVar1 = std::operator<<(poVar1,(string *)&local_340);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "%type_uniformconst_image_sparse_with_sampler = OpTypePointer UniformConstant %type_image_sparse_with_sampler\n"
                          );
  poVar1 = std::operator<<(poVar1,"%type_image_residency\t\t\t\t= ");
  getOpTypeImageResidency_abi_cxx11_
            (&local_300,(sparse *)(ulong)(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,
             imageType_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_300);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "%type_uniformconst_image_residency\t= OpTypePointer UniformConstant %type_image_residency\n"
                          );
  poVar1 = std::operator<<(poVar1,"%uniform_image_sparse = OpVariable ");
  poVar1 = std::operator<<(poVar1,(string *)&typeUniformConstImageSparse);
  poVar1 = std::operator<<(poVar1," UniformConstant\n");
  poVar1 = std::operator<<(poVar1,
                           "%uniform_image_texels = OpVariable %type_uniformconst_image_sparse UniformConstant\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%uniform_image_residency = OpVariable %type_uniformconst_image_residency UniformConstant\n"
                          );
  poVar1 = std::operator<<(poVar1,"%input_GlobalInvocationID = OpVariable %type_input_uvec3 Input\n"
                          );
  poVar1 = std::operator<<(poVar1,"%constant_uint_grid_x\t\t\t\t= OpSpecConstant %type_uint 1\n");
  poVar1 = std::operator<<(poVar1,"%constant_uint_grid_y\t\t\t\t= OpSpecConstant %type_uint 1\n");
  poVar1 = std::operator<<(poVar1,"%constant_uint_grid_z\t\t\t\t= OpSpecConstant %type_uint 1\n");
  poVar1 = std::operator<<(poVar1,
                           "%constant_uint_work_group_size_x\t= OpSpecConstant %type_uint 1\n");
  poVar1 = std::operator<<(poVar1,
                           "%constant_uint_work_group_size_y\t= OpSpecConstant %type_uint 1\n");
  poVar1 = std::operator<<(poVar1,
                           "%constant_uint_work_group_size_z\t= OpSpecConstant %type_uint 1\n");
  poVar1 = std::operator<<(poVar1,
                           "%input_WorkGroupSize = OpSpecConstantComposite %type_uvec3 %constant_uint_work_group_size_x %constant_uint_work_group_size_y %constant_uint_work_group_size_z\n"
                          );
  poVar1 = std::operator<<(poVar1,"%constant_uint_0\t\t\t\t= OpConstant %type_uint 0\n");
  poVar1 = std::operator<<(poVar1,"%constant_uint_1\t\t\t\t= OpConstant %type_uint 1\n");
  poVar1 = std::operator<<(poVar1,"%constant_uint_2\t\t\t\t= OpConstant %type_uint 2\n");
  poVar1 = std::operator<<(poVar1,"%constant_int_0\t\t\t\t\t= OpConstant %type_int 0\n");
  poVar1 = std::operator<<(poVar1,"%constant_int_1\t\t\t\t\t= OpConstant %type_int 1\n");
  poVar1 = std::operator<<(poVar1,"%constant_int_2\t\t\t\t\t= OpConstant %type_int 2\n");
  poVar1 = std::operator<<(poVar1,"%constant_bool_true\t\t\t\t= OpConstantTrue %type_bool\n");
  poVar1 = std::operator<<(poVar1,"%constant_uint_resident\t\t\t= OpConstant %type_uint ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "%constant_uvec4_resident\t\t= OpConstantComposite %type_uvec4 %constant_uint_resident %constant_uint_resident %constant_uint_resident %constant_uint_resident\n"
                          );
  poVar1 = std::operator<<(poVar1,"%constant_uint_not_resident\t\t= OpConstant %type_uint ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "%constant_uvec4_not_resident\t= OpConstantComposite %type_uvec4 %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident\n"
                          );
  poVar1 = std::operator<<(poVar1,"%func_main\t\t = OpFunction %type_void None %type_void_func\n");
  poVar1 = std::operator<<(poVar1,"%label_func_main = OpLabel\n");
  poVar1 = std::operator<<(poVar1,
                           "%access_GlobalInvocationID_x\t\t= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_0\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_uint_GlobalInvocationID_x\t= OpLoad %type_uint %access_GlobalInvocationID_x\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_int_GlobalInvocationID_x\t\t= OpBitcast %type_int %local_uint_GlobalInvocationID_x\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%access_GlobalInvocationID_y\t\t= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_1\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_uint_GlobalInvocationID_y\t= OpLoad %type_uint %access_GlobalInvocationID_y\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_int_GlobalInvocationID_y\t\t= OpBitcast %type_int %local_uint_GlobalInvocationID_y\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%access_GlobalInvocationID_z\t\t= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_2\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_uint_GlobalInvocationID_z\t= OpLoad %type_uint %access_GlobalInvocationID_z\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_int_GlobalInvocationID_z\t\t= OpBitcast %type_int %local_uint_GlobalInvocationID_z\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_ivec2_GlobalInvocationID_xy\t= OpCompositeConstruct %type_ivec2 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_ivec3_GlobalInvocationID_xyz = OpCompositeConstruct %type_ivec3 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y %local_int_GlobalInvocationID_z\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%comparison_range_x = OpULessThan %type_bool %local_uint_GlobalInvocationID_x %constant_uint_grid_x\n"
                          );
  poVar1 = std::operator<<(poVar1,"OpSelectionMerge %label_out_range_x None\n");
  poVar1 = std::operator<<(poVar1,
                           "OpBranchConditional %comparison_range_x %label_in_range_x %label_out_range_x\n"
                          );
  poVar1 = std::operator<<(poVar1,"%label_in_range_x = OpLabel\n");
  poVar1 = std::operator<<(poVar1,
                           "%comparison_range_y = OpULessThan %type_bool %local_uint_GlobalInvocationID_y %constant_uint_grid_y\n"
                          );
  poVar1 = std::operator<<(poVar1,"OpSelectionMerge %label_out_range_y None\n");
  poVar1 = std::operator<<(poVar1,
                           "OpBranchConditional %comparison_range_y %label_in_range_y %label_out_range_y\n"
                          );
  poVar1 = std::operator<<(poVar1,"%label_in_range_y = OpLabel\n");
  poVar1 = std::operator<<(poVar1,
                           "%comparison_range_z = OpULessThan %type_bool %local_uint_GlobalInvocationID_z %constant_uint_grid_z\n"
                          );
  poVar1 = std::operator<<(poVar1,"OpSelectionMerge %label_out_range_z None\n");
  poVar1 = std::operator<<(poVar1,
                           "OpBranchConditional %comparison_range_z %label_in_range_z %label_out_range_z\n"
                          );
  poVar1 = std::operator<<(poVar1,"%label_in_range_z = OpLabel\n");
  poVar1 = std::operator<<(poVar1,"%local_image_sparse = OpLoad ");
  poVar1 = std::operator<<(poVar1,(string *)&typeImageSparse);
  poVar1 = std::operator<<(poVar1," %uniform_image_sparse\n");
  std::__cxx11::string::string<std::allocator<char>>(local_260,"%local_sparse_op_result",&local_3a1)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,"%type_struct_int_img_comp_vec4",&local_3a2);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"%local_image_sparse",&local_3a3);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"%constant_int_0",&local_3a4);
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[9])(local_240,this,local_260,local_280,local_2a0,&coordString,local_220);
  poVar1 = std::operator<<(poVar1,local_240);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"%local_img_comp_vec4 = OpCompositeExtract ");
  poVar1 = std::operator<<(poVar1,(string *)&typeImgCompVec4);
  poVar1 = std::operator<<(poVar1," %local_sparse_op_result 1\n");
  poVar1 = std::operator<<(poVar1,
                           "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_image_texels = OpLoad %type_image_sparse %uniform_image_texels\n"
                          );
  poVar1 = std::operator<<(poVar1,"OpImageWrite %local_image_texels ");
  poVar1 = std::operator<<(poVar1,(string *)&coordString);
  poVar1 = std::operator<<(poVar1," %local_img_comp_vec4\n");
  poVar1 = std::operator<<(poVar1,
                           "%local_image_residency\t= OpLoad %type_image_residency %uniform_image_residency\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
                          );
  poVar1 = std::operator<<(poVar1,"OpSelectionMerge %branch_texel_resident None\n");
  poVar1 = std::operator<<(poVar1,
                           "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
                          );
  poVar1 = std::operator<<(poVar1,"%label_texel_resident = OpLabel\n");
  poVar1 = std::operator<<(poVar1,"OpImageWrite %local_image_residency ");
  poVar1 = std::operator<<(poVar1,(string *)&coordString);
  poVar1 = std::operator<<(poVar1," %constant_uvec4_resident\n");
  poVar1 = std::operator<<(poVar1,"OpBranch %branch_texel_resident\n");
  poVar1 = std::operator<<(poVar1,"%label_texel_not_resident = OpLabel\n");
  poVar1 = std::operator<<(poVar1,"OpImageWrite %local_image_residency ");
  poVar1 = std::operator<<(poVar1,(string *)&coordString);
  poVar1 = std::operator<<(poVar1," %constant_uvec4_not_resident\n");
  poVar1 = std::operator<<(poVar1,"OpBranch %branch_texel_resident\n");
  poVar1 = std::operator<<(poVar1,"%branch_texel_resident = OpLabel\n");
  poVar1 = std::operator<<(poVar1,"OpBranch %label_out_range_z\n");
  poVar1 = std::operator<<(poVar1,"%label_out_range_z = OpLabel\n");
  poVar1 = std::operator<<(poVar1,"OpBranch %label_out_range_y\n");
  poVar1 = std::operator<<(poVar1,"%label_out_range_y = OpLabel\n");
  poVar1 = std::operator<<(poVar1,"OpBranch %label_out_range_x\n");
  poVar1 = std::operator<<(poVar1,"%label_out_range_x = OpLabel\n");
  poVar1 = std::operator<<(poVar1,"OpReturn\n");
  std::operator<<(poVar1,"OpFunctionEnd\n");
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"compute",(allocator<char> *)&local_300);
  src_00 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add
                     (&programCollection->spirvAsmSources,&local_380);
  std::__cxx11::stringbuf::str();
  ::vk::operator<<(src_00,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&typeUniformConstImageSparse);
  std::__cxx11::string::~string((string *)&typeImageSparse);
  std::__cxx11::string::~string((string *)&typeImgCompVec4);
  std::__cxx11::string::~string((string *)&typeImgComp);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::~string((string *)&coordString);
  std::__cxx11::string::~string((string *)&formatQualStr);
  std::__cxx11::string::~string((string *)&formatDataStr);
  std::__cxx11::string::~string((string *)&imageTypeStr);
  return;
}

Assistant:

void SparseShaderIntrinsicsCaseStorage::initPrograms (vk::SourceCollections& programCollection) const
{
	const std::string	imageTypeStr	= getShaderImageType(m_format, m_imageType);
	const std::string	formatDataStr	= getShaderImageDataType(m_format);
	const std::string	formatQualStr	= getShaderImageFormatQualifier(m_format);

	const std::string  coordString		= getShaderImageCoordinates(m_imageType,
																	"%local_int_GlobalInvocationID_x",
																	"%local_ivec2_GlobalInvocationID_xy",
																	"%local_ivec3_GlobalInvocationID_xyz");
	// Create compute program
	std::ostringstream	src;

	const std::string	typeImgComp					= getImageComponentTypeName(m_format);
	const std::string	typeImgCompVec4				= getImageComponentVec4TypeName(m_format);
	const std::string	typeImageSparse				= getSparseImageTypeName();
	const std::string	typeUniformConstImageSparse	= getUniformConstSparseImageTypeName();

	src << "OpCapability Shader\n"
		<< "OpCapability ImageCubeArray\n"
		<< "OpCapability SparseResidency\n"
		<< "OpCapability StorageImageExtendedFormats\n"

		<< "%ext_import = OpExtInstImport \"GLSL.std.450\"\n"
		<< "OpMemoryModel Logical GLSL450\n"
		<< "OpEntryPoint GLCompute %func_main \"main\" %input_GlobalInvocationID\n"
		<< "OpExecutionMode %func_main LocalSize 1 1 1\n"
		<< "OpSource GLSL 440\n"

		<< "OpName %func_main \"main\"\n"

		<< "OpName %input_GlobalInvocationID \"gl_GlobalInvocationID\"\n"
		<< "OpName %input_WorkGroupSize \"gl_WorkGroupSize\"\n"

		<< "OpName %uniform_image_sparse \"u_imageSparse\"\n"
		<< "OpName %uniform_image_texels \"u_imageTexels\"\n"
		<< "OpName %uniform_image_residency \"u_imageResidency\"\n"

		<< "OpDecorate %input_GlobalInvocationID BuiltIn GlobalInvocationId\n"

		<< "OpDecorate %input_WorkGroupSize BuiltIn WorkgroupSize\n"

		<< "OpDecorate %constant_uint_grid_x SpecId 1\n"
		<< "OpDecorate %constant_uint_grid_y SpecId 2\n"
		<< "OpDecorate %constant_uint_grid_z SpecId 3\n"

		<< "OpDecorate %constant_uint_work_group_size_x SpecId 4\n"
		<< "OpDecorate %constant_uint_work_group_size_y SpecId 5\n"
		<< "OpDecorate %constant_uint_work_group_size_z SpecId 6\n"

		<< "OpDecorate %uniform_image_sparse DescriptorSet 0\n"
		<< "OpDecorate %uniform_image_sparse Binding " << BINDING_IMAGE_SPARSE << "\n"

		<< "OpDecorate %uniform_image_texels DescriptorSet 0\n"
		<< "OpDecorate %uniform_image_texels Binding " << BINDING_IMAGE_TEXELS << "\n"
		<< "OpDecorate %uniform_image_texels NonReadable\n"

		<< "OpDecorate %uniform_image_residency DescriptorSet 0\n"
		<< "OpDecorate %uniform_image_residency Binding " << BINDING_IMAGE_RESIDENCY << "\n"
		<< "OpDecorate %uniform_image_residency NonReadable\n"

		// Declare data types
		<< "%type_bool						= OpTypeBool\n"
		<< "%type_int						= OpTypeInt 32 1\n"
		<< "%type_uint						= OpTypeInt 32 0\n"
		<< "%type_ivec2						= OpTypeVector %type_int  2\n"
		<< "%type_ivec3						= OpTypeVector %type_int  3\n"
		<< "%type_ivec4						= OpTypeVector %type_int  4\n"
		<< "%type_uvec3						= OpTypeVector %type_uint 3\n"
		<< "%type_uvec4						= OpTypeVector %type_uint 4\n"
		<< "%type_struct_int_img_comp_vec4	= OpTypeStruct %type_int " << typeImgCompVec4 << "\n"

		<< "%type_input_uint		= OpTypePointer Input %type_uint\n"
		<< "%type_input_uvec3		= OpTypePointer Input %type_uvec3\n"

		<< "%type_function_int			 = OpTypePointer Function %type_int\n"
		<< "%type_function_img_comp_vec4 = OpTypePointer Function " << typeImgCompVec4 << "\n"

		<< "%type_void				= OpTypeVoid\n"
		<< "%type_void_func			= OpTypeFunction %type_void\n"

		// Sparse image without sampler type declaration
		<< "%type_image_sparse = " << getOpTypeImageSparse(m_imageType, m_format, typeImgComp, false) << "\n"
		<< "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_image_sparse\n"

		// Sparse image with sampler type declaration
		<< "%type_image_sparse_with_sampler = " << getOpTypeImageSparse(m_imageType, m_format, typeImgComp, true) << "\n"
		<< "%type_uniformconst_image_sparse_with_sampler = OpTypePointer UniformConstant %type_image_sparse_with_sampler\n"

		// Residency image type declaration
		<< "%type_image_residency				= " << getOpTypeImageResidency(m_imageType) << "\n"
		<< "%type_uniformconst_image_residency	= OpTypePointer UniformConstant %type_image_residency\n"

		// Declare sparse image variable
		<< "%uniform_image_sparse = OpVariable " << typeUniformConstImageSparse << " UniformConstant\n"

		// Declare output image variable for storing texels
		<< "%uniform_image_texels = OpVariable %type_uniformconst_image_sparse UniformConstant\n"

		// Declare output image variable for storing residency information
		<< "%uniform_image_residency = OpVariable %type_uniformconst_image_residency UniformConstant\n"

		// Declare input variables
		<< "%input_GlobalInvocationID = OpVariable %type_input_uvec3 Input\n"

		<< "%constant_uint_grid_x				= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_grid_y				= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_grid_z				= OpSpecConstant %type_uint 1\n"

		<< "%constant_uint_work_group_size_x	= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_work_group_size_y	= OpSpecConstant %type_uint 1\n"
		<< "%constant_uint_work_group_size_z	= OpSpecConstant %type_uint 1\n"
		<< "%input_WorkGroupSize = OpSpecConstantComposite %type_uvec3 %constant_uint_work_group_size_x %constant_uint_work_group_size_y %constant_uint_work_group_size_z\n"

		// Declare constants
		<< "%constant_uint_0				= OpConstant %type_uint 0\n"
		<< "%constant_uint_1				= OpConstant %type_uint 1\n"
		<< "%constant_uint_2				= OpConstant %type_uint 2\n"
		<< "%constant_int_0					= OpConstant %type_int 0\n"
		<< "%constant_int_1					= OpConstant %type_int 1\n"
		<< "%constant_int_2					= OpConstant %type_int 2\n"
		<< "%constant_bool_true				= OpConstantTrue %type_bool\n"
		<< "%constant_uint_resident			= OpConstant %type_uint " << MEMORY_BLOCK_BOUND_VALUE << "\n"
		<< "%constant_uvec4_resident		= OpConstantComposite %type_uvec4 %constant_uint_resident %constant_uint_resident %constant_uint_resident %constant_uint_resident\n"
		<< "%constant_uint_not_resident		= OpConstant %type_uint " << MEMORY_BLOCK_NOT_BOUND_VALUE << "\n"
		<< "%constant_uvec4_not_resident	= OpConstantComposite %type_uvec4 %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident %constant_uint_not_resident\n"

		// Call main function
		<< "%func_main		 = OpFunction %type_void None %type_void_func\n"
		<< "%label_func_main = OpLabel\n"

		// Load GlobalInvocationID.xyz into local variables
		<< "%access_GlobalInvocationID_x		= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_0\n"
		<< "%local_uint_GlobalInvocationID_x	= OpLoad %type_uint %access_GlobalInvocationID_x\n"
		<< "%local_int_GlobalInvocationID_x		= OpBitcast %type_int %local_uint_GlobalInvocationID_x\n"

		<< "%access_GlobalInvocationID_y		= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_1\n"
		<< "%local_uint_GlobalInvocationID_y	= OpLoad %type_uint %access_GlobalInvocationID_y\n"
		<< "%local_int_GlobalInvocationID_y		= OpBitcast %type_int %local_uint_GlobalInvocationID_y\n"

		<< "%access_GlobalInvocationID_z		= OpAccessChain %type_input_uint %input_GlobalInvocationID %constant_uint_2\n"
		<< "%local_uint_GlobalInvocationID_z	= OpLoad %type_uint %access_GlobalInvocationID_z\n"
		<< "%local_int_GlobalInvocationID_z		= OpBitcast %type_int %local_uint_GlobalInvocationID_z\n"

		<< "%local_ivec2_GlobalInvocationID_xy	= OpCompositeConstruct %type_ivec2 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y\n"
		<< "%local_ivec3_GlobalInvocationID_xyz = OpCompositeConstruct %type_ivec3 %local_int_GlobalInvocationID_x %local_int_GlobalInvocationID_y %local_int_GlobalInvocationID_z\n"

		<< "%comparison_range_x = OpULessThan %type_bool %local_uint_GlobalInvocationID_x %constant_uint_grid_x\n"
		<< "OpSelectionMerge %label_out_range_x None\n"
		<< "OpBranchConditional %comparison_range_x %label_in_range_x %label_out_range_x\n"
		<< "%label_in_range_x = OpLabel\n"

		<< "%comparison_range_y = OpULessThan %type_bool %local_uint_GlobalInvocationID_y %constant_uint_grid_y\n"
		<< "OpSelectionMerge %label_out_range_y None\n"
		<< "OpBranchConditional %comparison_range_y %label_in_range_y %label_out_range_y\n"
		<< "%label_in_range_y = OpLabel\n"

		<< "%comparison_range_z = OpULessThan %type_bool %local_uint_GlobalInvocationID_z %constant_uint_grid_z\n"
		<< "OpSelectionMerge %label_out_range_z None\n"
		<< "OpBranchConditional %comparison_range_z %label_in_range_z %label_out_range_z\n"
		<< "%label_in_range_z = OpLabel\n"

		// Load sparse image
		<< "%local_image_sparse = OpLoad " << typeImageSparse << " %uniform_image_sparse\n"

		// Call OpImageSparse*
		<< sparseImageOpString("%local_sparse_op_result", "%type_struct_int_img_comp_vec4", "%local_image_sparse", coordString, "%constant_int_0") << "\n"

		// Load the texel from the sparse image to local variable for OpImageSparse*
		<< "%local_img_comp_vec4 = OpCompositeExtract " << typeImgCompVec4 << " %local_sparse_op_result 1\n"

		// Load residency code for OpImageSparse*
		<< "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"
		// End Call OpImageSparse*

		// Load texels image
		<< "%local_image_texels = OpLoad %type_image_sparse %uniform_image_texels\n"

		// Write the texel to output image via OpImageWrite
		<< "OpImageWrite %local_image_texels " << coordString << " %local_img_comp_vec4\n"

		// Load residency info image
		<< "%local_image_residency	= OpLoad %type_image_residency %uniform_image_residency\n"

		// Check if loaded texel is placed in resident memory
		<< "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
		<< "OpSelectionMerge %branch_texel_resident None\n"
		<< "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
		<< "%label_texel_resident = OpLabel\n"

		// Loaded texel is in resident memory
		<< "OpImageWrite %local_image_residency " << coordString << " %constant_uvec4_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%label_texel_not_resident = OpLabel\n"

		// Loaded texel is not in resident memory
		<< "OpImageWrite %local_image_residency " << coordString << " %constant_uvec4_not_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%branch_texel_resident = OpLabel\n"

		<< "OpBranch %label_out_range_z\n"
		<< "%label_out_range_z = OpLabel\n"

		<< "OpBranch %label_out_range_y\n"
		<< "%label_out_range_y = OpLabel\n"

		<< "OpBranch %label_out_range_x\n"
		<< "%label_out_range_x = OpLabel\n"

		<< "OpReturn\n"
		<< "OpFunctionEnd\n";

	programCollection.spirvAsmSources.add("compute") << src.str();
}